

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O3

void __thiscall
Diligent::ShaderVariableManagerGL::ImageBindInfo::BindResource
          (ImageBindInfo *this,BindResourceInfo *BindInfo)

{
  SHADER_RESOURCE_TYPE ResourceType;
  ShaderResourceCacheGL *this_00;
  IDeviceObject *pIVar1;
  PipelineResourceDesc *ResDesc;
  ResourceAttribs *pRVar2;
  CachedResourceView *pCVar3;
  char (*in_R8) [41];
  initializer_list<Diligent::BUFFER_VIEW_TYPE> ExpectedViewTypes;
  char *pcVar4;
  RefCntAutoPtr<Diligent::BufferViewGLImpl> pViewGL_1;
  string msg;
  
  ResDesc = GetResourceDesc((this->
                            super_GLVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo>).
                            super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                            .m_ParentManager,
                            (this->
                            super_GLVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo>).
                            super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                            .m_ResIndex);
  pRVar2 = GetResourceAttribs((this->
                              super_GLVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo>
                              ).
                              super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                              .m_ParentManager,
                              (this->
                              super_GLVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo>
                              ).
                              super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                              .m_ResIndex);
  if (ResDesc->ArraySize <= BindInfo->ArrayIndex) {
    FormatString<char[89]>
              (&msg,(char (*) [89])
                    "Index is out of range, but it should\'ve been corrected by ShaderVariableBase::SetArray()"
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BindResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
               ,0x128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = (((this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo>).
              super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
             .m_ParentManager)->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>)
            .m_ResourceCache;
  ResourceType = ResDesc->ResourceType;
  if (ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV) {
    pIVar1 = BindInfo->pObject;
    pViewGL_1.m_pObject = (BufferViewGLImpl *)0x0;
    if (pIVar1 != (IDeviceObject *)0x0) {
      (**(pIVar1->super_IObject)._vptr_IObject)(pIVar1,IID_BufferViewGL,&pViewGL_1);
    }
    pcVar4 = (char *)0x1b249e;
    pCVar3 = ShaderResourceCacheGL::GetConstImage
                       (this_00,BindInfo->ArrayIndex + pRVar2->CacheOffset);
    msg._M_dataplus._M_p._0_1_ = 2;
    ExpectedViewTypes._M_len = 1;
    ExpectedViewTypes._M_array = (iterator)0x1;
    VerifyResourceViewBinding<Diligent::BufferViewGLImpl,Diligent::BUFFER_VIEW_TYPE>
              ((Diligent *)ResDesc,(PipelineResourceDesc *)BindInfo,
               (BindResourceInfo *)pViewGL_1.m_pObject,(BufferViewGLImpl *)&msg,ExpectedViewTypes,
               RESOURCE_DIM_UNDEFINED,SUB81((pCVar3->pView).m_pObject,0),
               (IDeviceObject *)
               (((((this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo>).
                   super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                  .m_ParentManager)->
                 super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).m_pSignature)
               ->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
               super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
               .m_Desc.super_DeviceObjectAttribs.Name,pcVar4);
    if ((ResDesc->Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) == PIPELINE_RESOURCE_FLAG_NONE) {
      FormatString<char[93]>
                (&msg,(char (*) [93])
                      "FORMATTED_BUFFER resource flag is not set for an image buffer - this should\'ve not happened."
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"BindResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
                 ,0x14b);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    ValidateBufferMode<Diligent::BufferViewGLImpl>(ResDesc,BindInfo->ArrayIndex,pViewGL_1.m_pObject)
    ;
    pCVar3 = ShaderResourceCacheGL::GetConstImage
                       (this_00,BindInfo->ArrayIndex + pRVar2->CacheOffset);
    ShaderResourceCacheGL::CachedResourceView::Set(pCVar3,&pViewGL_1);
    LOCK();
    (this_00->super_ShaderResourceCacheBase).m_DvpRevision.super___atomic_base<unsigned_int>._M_i =
         (this_00->super_ShaderResourceCacheBase).m_DvpRevision.super___atomic_base<unsigned_int>.
         _M_i + 1;
    UNLOCK();
    RefCntAutoPtr<Diligent::BufferViewGLImpl>::Release(&pViewGL_1);
  }
  else if (ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_UAV) {
    pIVar1 = BindInfo->pObject;
    msg._M_dataplus._M_p = (pointer)0x0;
    if (pIVar1 != (IDeviceObject *)0x0) {
      (**(pIVar1->super_IObject)._vptr_IObject)(pIVar1,IID_TextureViewGL,&msg);
    }
    pcVar4 = (char *)0x1b2405;
    pCVar3 = ShaderResourceCacheGL::GetConstImage
                       (this_00,BindInfo->ArrayIndex + pRVar2->CacheOffset);
    pViewGL_1.m_pObject._0_1_ = 5;
    VerifyResourceViewBinding<Diligent::TextureViewGLImpl,Diligent::TEXTURE_VIEW_TYPE>
              ((Diligent *)ResDesc,(PipelineResourceDesc *)BindInfo,
               (BindResourceInfo *)msg._M_dataplus._M_p,(TextureViewGLImpl *)&pViewGL_1,
               (initializer_list<Diligent::TEXTURE_VIEW_TYPE>)ZEXT816(1),RESOURCE_DIM_UNDEFINED,
               SUB81((pCVar3->pView).m_pObject,0),
               (IDeviceObject *)
               (((((this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo>).
                   super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                  .m_ParentManager)->
                 super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).m_pSignature)
               ->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
               super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
               .m_Desc.super_DeviceObjectAttribs.Name,pcVar4);
    pCVar3 = ShaderResourceCacheGL::GetConstImage
                       (this_00,BindInfo->ArrayIndex + pRVar2->CacheOffset);
    ShaderResourceCacheGL::CachedResourceView::Set
              (pCVar3,(RefCntAutoPtr<Diligent::TextureViewGLImpl> *)&msg,false);
    LOCK();
    (this_00->super_ShaderResourceCacheBase).m_DvpRevision.super___atomic_base<unsigned_int>._M_i =
         (this_00->super_ShaderResourceCacheBase).m_DvpRevision.super___atomic_base<unsigned_int>.
         _M_i + 1;
    UNLOCK();
    RefCntAutoPtr<Diligent::TextureViewGLImpl>::Release
              ((RefCntAutoPtr<Diligent::TextureViewGLImpl> *)&msg);
  }
  else {
    pViewGL_1.m_pObject = (BufferViewGLImpl *)GetShaderResourceTypeLiteralName(ResourceType,false);
    FormatString<char[26],char_const*,char[41]>
              (&msg,(Diligent *)"Unexpected resource type ",(char (*) [26])&pViewGL_1,
               (char **)". Texture UAV or buffer UAV is expected.",in_R8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BindResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
               ,0x153);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void ShaderVariableManagerGL::ImageBindInfo::BindResource(const BindResourceInfo& BindInfo)
{
    const auto& Desc = GetDesc();
    const auto& Attr = GetAttribs();

    VERIFY(BindInfo.ArrayIndex < Desc.ArraySize, "Index is out of range, but it should've been corrected by ShaderVariableBase::SetArray()");
    auto& ResourceCache = m_ParentManager.m_ResourceCache;

    if (Desc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_UAV)
    {
        // We cannot use ClassPtrCast<> here as the resource can be of wrong type
        RefCntAutoPtr<TextureViewGLImpl> pViewGL{BindInfo.pObject, IID_TextureViewGL};
#ifdef DILIGENT_DEVELOPMENT
        {
            const auto& CachedUAV = ResourceCache.GetConstImage(Attr.CacheOffset + BindInfo.ArrayIndex);
            VerifyResourceViewBinding(Desc, BindInfo, pViewGL.RawPtr(),
                                      {TEXTURE_VIEW_UNORDERED_ACCESS}, // Expected view type
                                      RESOURCE_DIM_UNDEFINED,          // Expected resource dimension - unknown at this point
                                      false,                           // IsMultisample (ignored when resource dim is unknown)
                                      CachedUAV.pView.RawPtr(),
                                      m_ParentManager.m_pSignature->GetDesc().Name);
        }
#endif
        ResourceCache.SetTexImage(Attr.CacheOffset + BindInfo.ArrayIndex, std::move(pViewGL));
    }
    else if (Desc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV)
    {
        // We cannot use ClassPtrCast<> here as the resource can be of wrong type
        RefCntAutoPtr<BufferViewGLImpl> pViewGL{BindInfo.pObject, IID_BufferViewGL};
#ifdef DILIGENT_DEVELOPMENT
        {
            const auto& CachedUAV = ResourceCache.GetConstImage(Attr.CacheOffset + BindInfo.ArrayIndex);
            VerifyResourceViewBinding(Desc, BindInfo, pViewGL.RawPtr(),
                                      {BUFFER_VIEW_UNORDERED_ACCESS}, // Expected view type
                                      RESOURCE_DIM_BUFFER,            // Expected resource dimension
                                      false,                          // IsMultisample (ignored when resource dim is buffer)
                                      CachedUAV.pView.RawPtr(),
                                      m_ParentManager.m_pSignature->GetDesc().Name);

            VERIFY((Desc.Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) != 0,
                   "FORMATTED_BUFFER resource flag is not set for an image buffer - this should've not happened.");
            ValidateBufferMode(Desc, BindInfo.ArrayIndex, pViewGL.RawPtr());
        }
#endif
        ResourceCache.SetBufImage(Attr.CacheOffset + BindInfo.ArrayIndex, std::move(pViewGL));
    }
    else
    {
        UNEXPECTED("Unexpected resource type ", GetShaderResourceTypeLiteralName(Desc.ResourceType), ". Texture UAV or buffer UAV is expected.");
    }
}